

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O2

ostream * pstore::repo::operator<<(ostream *os,section_content *c)

{
  pointer_based_iterator<const_unsigned_char> __last;
  ostream *poVar1;
  undefined1 auStack_58 [16];
  ostream *local_48;
  char *local_40;
  ostream *local_38;
  char *local_30;
  ostream *local_28;
  char *local_20;
  
  poVar1 = std::operator<<(os,"{ kind:");
  poVar1 = operator<<(poVar1,c->kind);
  poVar1 = std::operator<<(poVar1,", align:");
  poVar1 = std::operator<<(poVar1,c->align);
  std::operator<<(poVar1,", data:[");
  __last.pos_ = (c->data).buffer_;
  local_20 = ", ";
  local_28 = os;
  std::
  copy<pstore::pointer_based_iterator<unsigned_char_const>,std::ostream_iterator<unsigned_int,char,std::char_traits<char>>>
            ((pointer_based_iterator<const_unsigned_char>)auStack_58,__last,
             (ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> *)
             (__last.pos_ + (c->data).elements_));
  std::operator<<(os,"], ifixups:[");
  local_30 = ", ";
  local_38 = os;
  std::
  copy<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,std::ostream_iterator<pstore::repo::internal_fixup,char,std::char_traits<char>>>
            ((internal_fixup *)auStack_58,
             (c->ifixups).
             super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (ostream_iterator<pstore::repo::internal_fixup,_char,_std::char_traits<char>_> *)
             (c->ifixups).
             super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::operator<<(os,"], xfixups:[");
  local_40 = ", ";
  local_48 = os;
  std::
  copy<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,std::ostream_iterator<pstore::repo::external_fixup,char,std::char_traits<char>>>
            ((external_fixup *)auStack_58,
             (c->xfixups).
             super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (ostream_iterator<pstore::repo::external_fixup,_char,_std::char_traits<char>_> *)
             (c->xfixups).
             super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return os;
}

Assistant:

std::ostream & operator<< (std::ostream & os, section_content const & c) {
            os << "{ kind:" << c.kind << ", align:" << c.align << ", data:[";
            std::copy (std::begin (c.data), std::end (c.data),
                       std::ostream_iterator<unsigned> (os, ", "));
            os << "], ifixups:[";
            std::copy (std::begin (c.ifixups), std::end (c.ifixups),
                       std::ostream_iterator<internal_fixup> (os, ", "));
            os << "], xfixups:[";
            std::copy (std::begin (c.xfixups), std::end (c.xfixups),
                       std::ostream_iterator<external_fixup> (os, ", "));
            return os;
        }